

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O1

uint8_t * wirehair::SIMDSafeAllocate(size_t size)

{
  void *pvVar1;
  uint8_t *puVar2;
  uint uVar3;
  
  pvVar1 = calloc(1,size + 0x20);
  if (pvVar1 == (void *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    uVar3 = (uint)pvVar1 & 0x1f;
    *(char *)((long)pvVar1 + (0x1f - (ulong)uVar3)) = (char)uVar3;
    puVar2 = (uint8_t *)((long)pvVar1 + (0x20 - (ulong)uVar3));
  }
  return puVar2;
}

Assistant:

uint8_t* SIMDSafeAllocate(size_t size)
{
    uint8_t* data = (uint8_t*)calloc(1, GF256_ALIGN_BYTES + size);
    if (!data) {
        return nullptr;
    }
    unsigned offset = (unsigned)((uintptr_t)data % GF256_ALIGN_BYTES);
    data += GF256_ALIGN_BYTES - offset;
    data[-1] = (uint8_t)offset;
    return data;
}